

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameters.h
# Opt level: O2

void __thiscall
DIS::EntityStatePdu::setDeadReckoningParameters(EntityStatePdu *this,DeadReckoningParameters *pX)

{
  undefined8 uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  float fVar9;
  
  uVar2 = pX->_parameters[0];
  uVar3 = pX->_parameters[1];
  uVar4 = pX->_parameters[2];
  uVar5 = pX->_parameters[3];
  uVar6 = pX->_parameters[4];
  uVar7 = pX->_parameters[5];
  uVar8 = pX->_parameters[6];
  uVar1 = *(undefined8 *)(pX->_parameters + 7);
  (this->_deadReckoningParameters)._deadReckoningAlgorithm = pX->_deadReckoningAlgorithm;
  (this->_deadReckoningParameters)._parameters[0] = uVar2;
  (this->_deadReckoningParameters)._parameters[1] = uVar3;
  (this->_deadReckoningParameters)._parameters[2] = uVar4;
  (this->_deadReckoningParameters)._parameters[3] = uVar5;
  (this->_deadReckoningParameters)._parameters[4] = uVar6;
  (this->_deadReckoningParameters)._parameters[5] = uVar7;
  (this->_deadReckoningParameters)._parameters[6] = uVar8;
  *(undefined8 *)((this->_deadReckoningParameters)._parameters + 7) = uVar1;
  fVar9 = (pX->_entityLinearAcceleration)._y;
  (this->_deadReckoningParameters)._entityLinearAcceleration._x = (pX->_entityLinearAcceleration)._x
  ;
  (this->_deadReckoningParameters)._entityLinearAcceleration._y = fVar9;
  (this->_deadReckoningParameters)._entityLinearAcceleration._z = (pX->_entityLinearAcceleration)._z
  ;
  fVar9 = (pX->_entityAngularVelocity)._y;
  (this->_deadReckoningParameters)._entityAngularVelocity._x = (pX->_entityAngularVelocity)._x;
  (this->_deadReckoningParameters)._entityAngularVelocity._y = fVar9;
  (this->_deadReckoningParameters)._entityAngularVelocity._z = (pX->_entityAngularVelocity)._z;
  return;
}

Assistant:

class OPENDIS7_EXPORT DeadReckoningParameters
{
protected:
  /** Algorithm to use in computing dead reckoning. See EBV doc. */
  unsigned char _deadReckoningAlgorithm; 

  /** Dead reckoning parameters. Contents depends on algorithm. */
  unsigned char _parameters[15]; 

  /** Linear acceleration of the entity */
  Vector3Float _entityLinearAcceleration; 

  /** Angular velocity of the entity */
  Vector3Float _entityAngularVelocity; 


 public:
    DeadReckoningParameters();
    virtual ~DeadReckoningParameters();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getDeadReckoningAlgorithm() const; 
    void setDeadReckoningAlgorithm(unsigned char pX); 

    unsigned char*  getParameters(); 
    const unsigned char*  getParameters() const; 
    void setParameters( const unsigned char*    pX);

    Vector3Float& getEntityLinearAcceleration(); 
    const Vector3Float&  getEntityLinearAcceleration() const; 
    void setEntityLinearAcceleration(const Vector3Float    &pX);

    Vector3Float& getEntityAngularVelocity(); 
    const Vector3Float&  getEntityAngularVelocity() const; 
    void setEntityAngularVelocity(const Vector3Float    &pX);


virtual int getMarshalledSize() const;

     bool operator  ==(const DeadReckoningParameters& rhs) const;
}